

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O0

void __thiscall ThreadedTest::RunThreads(ThreadedTest *this)

{
  bool bVar1;
  thread *thread;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  type local_40 [2];
  int local_2c;
  undefined1 local_28 [4];
  int i;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  ThreadedTest *this_local;
  
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_28);
  for (local_2c = 0; local_2c < this->num_threads_; local_2c = local_2c + 1) {
    local_40[1] = 0;
    local_40[0] = 0x31;
    __range1 = (vector<std::thread,_std::allocator<std::thread>_> *)this;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<void(ThreadedTest::*)(int),ThreadedTest*,int&>
              ((vector<std::thread,std::allocator<std::thread>> *)local_28,local_40,
               (ThreadedTest **)&__range1,&local_2c);
  }
  __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                     ((vector<std::thread,_std::allocator<std::thread>_> *)local_28);
  thread = (thread *)
           std::vector<std::thread,_std::allocator<std::thread>_>::end
                     ((vector<std::thread,_std::allocator<std::thread>_> *)local_28);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                *)&thread);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&__end1);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end1);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_28);
  return;
}

Assistant:

void RunThreads() {
    std::vector<std::thread> threads;

    for (int i = 0; i < num_threads_; ++i) {
      threads.emplace_back(&ThreadedTest::RunShard, this, i);
    }

    for (std::thread& thread : threads) {
      thread.join();
    }
  }